

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  CppType CVar2;
  ulong uVar3;
  second_type *ppFVar4;
  reference ppMVar5;
  value_type local_130;
  value_type local_120;
  uint local_f0;
  string local_e0;
  string local_c0;
  value_type local_a0;
  Message *sub_message;
  second_type local_90;
  FieldValuePrinter *printer;
  int field_index;
  int j;
  byte local_51;
  undefined1 local_50 [7];
  bool is_map;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  int count;
  TextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  generator_local = (TextGenerator *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  if (((((this->use_short_repeated_primitives_ & 1U) == 0) ||
       (bVar1 = FieldDescriptor::is_repeated(field), !bVar1)) ||
      (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)generator_local),
      CVar2 == CPPTYPE_STRING)) ||
     (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)generator_local),
     CVar2 == CPPTYPE_MESSAGE)) {
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)generator_local);
    if (bVar1) {
      map_entries.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (**(code **)(*(long *)field_local + 0x30))(field_local,reflection_local,generator_local);
    }
    else {
      uVar3 = (**(code **)(*(long *)field_local + 0x28))
                        (field_local,reflection_local,generator_local);
      if ((uVar3 & 1) != 0) {
        map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_50);
    local_51 = FieldDescriptor::is_map((FieldDescriptor *)generator_local);
    if ((bool)local_51) {
      DynamicMapSorter::Sort
                ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)&field_index,(Message *)reflection_local,
                 map_entries.
                 super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(Reflection *)field_local,
                 (FieldDescriptor *)generator_local);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::operator=((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   *)local_50,
                  (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   *)&field_index);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 *)&field_index);
    }
    for (printer._4_4_ = 0;
        (int)printer._4_4_ <
        (int)map_entries.
             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        printer._4_4_ = printer._4_4_ + 1) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)generator_local);
      if (bVar1) {
        local_f0 = printer._4_4_;
      }
      else {
        local_f0 = 0xffffffff;
      }
      printer._0_4_ = local_f0;
      PrintFieldName(this,(Message *)reflection_local,(Reflection *)field_local,
                     (FieldDescriptor *)generator_local,generator);
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)generator_local);
      if (CVar2 == CPPTYPE_MESSAGE) {
        sub_message = (Message *)
                      internal::scoped_ptr<const_google::protobuf::TextFormat::FieldValuePrinter>::
                      get(&this->default_field_value_printer_);
        ppFVar4 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                            (&this->custom_printers_,(first_type *)&generator_local,
                             (second_type *)&sub_message);
        local_90 = *ppFVar4;
        bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)generator_local);
        if (bVar1) {
          if ((local_51 & 1) == 0) {
            local_120 = (value_type)
                        (**(code **)(*(long *)field_local + 0x1a0))
                                  (field_local,reflection_local,generator_local,printer._4_4_);
          }
          else {
            ppMVar5 = std::
                      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ::operator[]((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                    *)local_50,(long)(int)printer._4_4_);
            local_120 = *ppMVar5;
          }
          local_130 = local_120;
        }
        else {
          local_130 = (value_type)
                      (**(code **)(*(long *)field_local + 0xd8))
                                (field_local,reflection_local,generator_local,0);
        }
        local_a0 = local_130;
        (*local_90->_vptr_FieldValuePrinter[0xd])
                  (&local_c0,local_90,local_130,(ulong)(uint)printer,
                   (ulong)map_entries.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   (ulong)(this->single_line_mode_ & 1));
        TextGenerator::Print(generator,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        TextGenerator::Indent(generator);
        Print(this,local_a0,generator);
        TextGenerator::Outdent(generator);
        (*local_90->_vptr_FieldValuePrinter[0xe])
                  (&local_e0,local_90,local_a0,(ulong)(uint)printer,
                   (ulong)map_entries.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   (ulong)(this->single_line_mode_ & 1));
        TextGenerator::Print(generator,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      else {
        TextGenerator::Print(generator,": ");
        PrintFieldValue(this,(Message *)reflection_local,(Reflection *)field_local,
                        (FieldDescriptor *)generator_local,(uint)printer,generator);
        if ((this->single_line_mode_ & 1U) == 0) {
          TextGenerator::Print(generator,"\n");
        }
        else {
          TextGenerator::Print(generator," ");
        }
      }
    }
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_50);
  }
  else {
    PrintShortRepeatedField
              (this,(Message *)reflection_local,(Reflection *)field_local,
               (FieldDescriptor *)generator_local,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator& generator) const {
  if (use_short_repeated_primitives_ &&
      field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field)) {
    count = 1;
  }

  std::vector<const Message*> map_entries;
  const bool is_map = field->is_map();
  if (is_map) {
    map_entries = DynamicMapSorter::Sort(message, count, reflection, field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FieldValuePrinter* printer = FindWithDefault(
          custom_printers_, field, default_field_value_printer_.get());
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *map_entries[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      generator.Print(
          printer->PrintMessageStart(
              sub_message, field_index, count, single_line_mode_));
      generator.Indent();
      Print(sub_message, generator);
      generator.Outdent();
      generator.Print(
          printer->PrintMessageEnd(
              sub_message, field_index, count, single_line_mode_));
    } else {
      generator.Print(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator.Print(" ");
      } else {
        generator.Print("\n");
      }
    }
  }
}